

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.cpp
# Opt level: O0

void * operator_new__(size_t sz,nothrow_t *param_2)

{
  bool bVar1;
  TheCustomHeapType *this;
  bool *pbVar2;
  size_t in_RDI;
  void *ptr;
  void *ptr_1;
  char *local_8;
  
  bVar1 = isCustomHeapInitialized();
  if (bVar1) {
    this = getCustomHeap();
    local_8 = (char *)HL::
                      ANSIWrapper<Hoard::ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>_>
                      ::malloc(this,in_RDI);
    if (local_8 == (char *)0x0) {
      fprintf(_stderr,"INTERNAL FAILURE.\n");
      abort();
    }
  }
  else {
    pbVar2 = (bool *)(initBufferPtr + in_RDI);
    if (&xxmalloc::initialized < pbVar2) {
      initBufferPtr = pbVar2;
      abort();
    }
    if ((xxmalloc::initialized & 1U) == 0) {
      xxmalloc::initialized = true;
    }
    local_8 = initBufferPtr;
    initBufferPtr = pbVar2;
  }
  return local_8;
}

Assistant:

void * FLATTEN operator new[] (size_t sz, const std::nothrow_t&)
  throw()
 {
  return xxmalloc(sz);
}